

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

void anon_unknown.dwarf_51330c::RawLogVA
               (LogSeverity severity,char *file,int line,char *format,__va_list_tag *ap)

{
  size_t len;
  char *local_c18;
  undefined1 local_c09;
  char **ppcStack_c08;
  bool no_chop;
  char *prefix_end;
  FnPtr log_prefix_hook_ptr;
  bool enabled;
  char **ppcStack_bf0;
  int size;
  char *buf;
  char buffer [3000];
  __va_list_tag *ap_local;
  char *format_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  
  ppcStack_bf0 = &buf;
  log_prefix_hook_ptr._4_4_ = 3000;
  log_prefix_hook_ptr._3_1_ = 1;
  if (((int)severity < 1) && ((int)severity < 3)) {
    log_prefix_hook_ptr._3_1_ = 0;
  }
  buffer._2992_8_ = ap;
  format_local._4_4_ = line;
  pcStack_18 = file;
  file_local._4_4_ = severity;
  prefix_end = (char *)absl::base_internal::
                       AtomicHook<bool_(*)(absl::LogSeverity,_const_char_*,_int,_char_**,_int_*)>::
                       Load(&log_prefix_hook);
  if ((FnPtr)prefix_end == (FnPtr)0x0) {
    if ((log_prefix_hook_ptr._3_1_ & 1) != 0) {
      DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&log_prefix_hook_ptr + 4),
               "[%s : %d] RAW: ",pcStack_18,(ulong)format_local._4_4_);
    }
  }
  else {
    log_prefix_hook_ptr._3_1_ =
         (*(code *)prefix_end)
                   (file_local._4_4_,pcStack_18,format_local._4_4_,(char **)&stack0xfffffffffffff410
                    ,(int *)((long)&log_prefix_hook_ptr + 4));
  }
  ppcStack_c08 = ppcStack_bf0;
  if ((log_prefix_hook_ptr._3_1_ & 1) != 0) {
    local_c09 = VADoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&log_prefix_hook_ptr + 4)
                           ,format,(__va_list_tag *)buffer._2992_8_);
    if ((bool)local_c09) {
      DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&log_prefix_hook_ptr + 4),"\n");
    }
    else {
      DoRawLog((char **)&stack0xfffffffffffff410,(int *)((long)&log_prefix_hook_ptr + 4),"%s",
               " ... (message truncated)\n");
    }
    len = strlen((char *)&buf);
    absl::raw_logging_internal::SafeWriteToStderr((char *)&buf,len);
  }
  if (file_local._4_4_ != kFatal) {
    return;
  }
  local_c18 = buffer + 0xbb0;
  absl::base_internal::AtomicHook<void(*)(char_const*,int,char_const*,char_const*,char_const*)>::
  operator()((AtomicHook<void(*)(char_const*,int,char_const*,char_const*,char_const*)> *)&abort_hook
             ,&stack0xffffffffffffffe8,(int *)((long)&format_local + 4),(char (*) [3000])&buf,
             (char **)&stack0xfffffffffffff3f8,&local_c18);
  abort();
}

Assistant:

void RawLogVA(absl::LogSeverity severity, const char* file, int line,
              const char* format, va_list ap) {
  char buffer[kLogBufSize];
  char* buf = buffer;
  int size = sizeof(buffer);
#ifdef ABSL_LOW_LEVEL_WRITE_SUPPORTED
  bool enabled = true;
#else
  bool enabled = false;
#endif

#ifdef ABSL_MIN_LOG_LEVEL
  if (static_cast<int>(severity) < ABSL_MIN_LOG_LEVEL &&
      severity < absl::LogSeverity::kFatal) {
    enabled = false;
  }
#endif

  auto log_prefix_hook_ptr = log_prefix_hook.Load();
  if (log_prefix_hook_ptr) {
    enabled = log_prefix_hook_ptr(severity, file, line, &buf, &size);
  } else {
    if (enabled) {
      DoRawLog(&buf, &size, "[%s : %d] RAW: ", file, line);
    }
  }
  const char* const prefix_end = buf;

#ifdef ABSL_LOW_LEVEL_WRITE_SUPPORTED
  if (enabled) {
    bool no_chop = VADoRawLog(&buf, &size, format, ap);
    if (no_chop) {
      DoRawLog(&buf, &size, "\n");
    } else {
      DoRawLog(&buf, &size, "%s", kTruncated);
    }
    absl::raw_logging_internal::SafeWriteToStderr(buffer, strlen(buffer));
  }
#else
  static_cast<void>(format);
  static_cast<void>(ap);
#endif

  // Abort the process after logging a FATAL message, even if the output itself
  // was suppressed.
  if (severity == absl::LogSeverity::kFatal) {
    abort_hook(file, line, buffer, prefix_end, buffer + kLogBufSize);
    abort();
  }
}